

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Student.cpp
# Opt level: O3

ostream * __thiscall L14_2::Student::output(Student *this,ostream *os)

{
  char cVar1;
  ostream *poVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = (uint)(this->super_valarray<double>)._M_size;
  if ((int)uVar4 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"empty array ",0xc);
  }
  else {
    uVar3 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>((this->super_valarray<double>)._M_data[uVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      cVar1 = (char)os;
      if ((int)((uVar3 & 0xffffffff) / 5) * 5 + 4 == (int)uVar3) {
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
      }
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar3);
    if (0x33333333 < uVar4 * -0x33333333) {
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
    }
  }
  return os;
}

Assistant:

std::ostream& Student::output(std::ostream &os) const {
        int i;
        int size = NumberArray::size();
        if (size > 0) {
            for (i = 0; i < size; i++) {
                os << NumberArray::operator[](i) << " ";
                if (i % 5 == 4) {
                    os << std::endl;
                }
            }
            if (i % 5 != 0) {
                os << std::endl;
            }
        } else {
            os << "empty array ";
        }
        return os;
    }